

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

void __thiscall
wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::ConstantExpressionRunner
          (ConstantExpressionRunner<wasm::CExpressionRunner> *this,Module *module,Flags flags,
          Index maxDepth,Index maxLoopIterations)

{
  (this->super_ExpressionRunner<wasm::CExpressionRunner>).module = module;
  (this->super_ExpressionRunner<wasm::CExpressionRunner>).maxDepth = maxDepth;
  (this->super_ExpressionRunner<wasm::CExpressionRunner>).depth = 0;
  (this->super_ExpressionRunner<wasm::CExpressionRunner>).maxLoopIterations = maxLoopIterations;
  (this->super_ExpressionRunner<wasm::CExpressionRunner>)._vptr_ExpressionRunner =
       (_func_int **)&PTR__ConstantExpressionRunner_00e1d448;
  *(Flags *)&(this->super_ExpressionRunner<wasm::CExpressionRunner>).field_0x1c = flags;
  (this->localValues)._M_h._M_buckets = &(this->localValues)._M_h._M_single_bucket;
  (this->localValues)._M_h._M_bucket_count = 1;
  (this->localValues)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->localValues)._M_h._M_element_count = 0;
  (this->localValues)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->localValues)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->localValues)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->globalValues)._M_h._M_buckets = &(this->globalValues)._M_h._M_single_bucket;
  (this->globalValues)._M_h._M_bucket_count = 1;
  (this->globalValues)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->globalValues)._M_h._M_element_count = 0;
  (this->globalValues)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->globalValues)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->globalValues)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

ConstantExpressionRunner(Module* module,
                           Flags flags,
                           Index maxDepth,
                           Index maxLoopIterations)
    : ExpressionRunner<SubType>(module, maxDepth, maxLoopIterations),
      flags(flags) {}